

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

void oSortDependencies(Abc_Ntk_t *pNtk,Vec_Int_t **oDep,int *iGroup)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  long lVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int i;
  
  p = Vec_IntAlloc(10);
  for (lVar4 = 0; lVar4 < pNtk->vPos->nSize; lVar4 = lVar4 + 1) {
    if (oDep[lVar4]->nSize != 1) {
      p_00 = Vec_IntAlloc(oDep[lVar4]->nSize);
      for (iVar5 = 0; pVVar6 = oDep[lVar4], iVar5 < pVVar6->nSize; iVar5 = iVar5 + 1) {
        iVar1 = Vec_IntEntry(pVVar6,iVar5);
        Vec_IntPushUniqueOrder(p,iGroup[iVar1]);
      }
      iVar5 = p->nSize;
      iVar1 = 0;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      for (; iVar1 != iVar5; iVar1 = iVar1 + 1) {
        for (i = 0; i < pVVar6->nSize; i = i + 1) {
          iVar2 = Vec_IntEntry(pVVar6,i);
          iVar2 = iGroup[iVar2];
          iVar3 = Vec_IntEntry(p,iVar1);
          if (iVar2 == iVar3) {
            iVar2 = Vec_IntEntry(oDep[lVar4],i);
            Vec_IntPush(p_00,iVar2);
            pVVar6 = oDep[lVar4];
            iVar2 = Vec_IntEntry(pVVar6,i);
            Vec_IntRemove(pVVar6,iVar2);
            i = i + -1;
          }
          pVVar6 = oDep[lVar4];
        }
      }
      Vec_IntFree(pVVar6);
      oDep[lVar4] = p_00;
      p->nSize = 0;
    }
  }
  Vec_IntFree(p);
  return;
}

Assistant:

void oSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, int* iGroup)
{
    int i, j, k;    
    Vec_Int_t * temp;
    Vec_Int_t * iGroupList;    
    
    iGroupList = Vec_IntAlloc( 10 );

    for(i = 0; i < Abc_NtkPoNum(pNtk); i++)
    {
        if(Vec_IntSize(oDep[i]) == 1)
            continue;    
        
        temp = Vec_IntAlloc( Vec_IntSize(oDep[i]) );

        for(j = 0; j < Vec_IntSize(oDep[i]); j++)
            Vec_IntPushUniqueOrder(iGroupList, iGroup[Vec_IntEntry(oDep[i], j)]);        

        for(j = 0; j < Vec_IntSize(iGroupList); j++)
        {
            for(k = 0; k < Vec_IntSize(oDep[i]); k++)
                if(iGroup[Vec_IntEntry(oDep[i], k)] == Vec_IntEntry(iGroupList, j))
                {
                    Vec_IntPush( temp, Vec_IntEntry(oDep[i], k) );
                    Vec_IntRemove( oDep[i], Vec_IntEntry(oDep[i], k) );
                    k--;
                }
        }

        Vec_IntFree( oDep[i] );
        oDep[i] = temp;
        Vec_IntClear( iGroupList );

        /*printf("Output %d: ", i);
        for(j = 0; j < Vec_IntSize(oDep[i]); j++)
            printf("%d ", Vec_IntEntry(oDep[i], j));
        printf("\n");*/
    }
    
    Vec_IntFree( iGroupList );
}